

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O2

void __thiscall
vkt::texture::util::TextureRenderer::addImageTransitionBarrier
          (TextureRenderer *this,VkCommandBuffer commandBuffer,VkImage image,
          VkPipelineStageFlags srcStageMask,VkPipelineStageFlags dstStageMask,
          VkAccessFlags srcAccessMask,VkAccessFlags dstAccessMask,VkImageLayout oldLayout,
          VkImageLayout newLayout)

{
  DeviceInterface *pDVar1;
  VkImageMemoryBarrier imageBarrier;
  
  pDVar1 = Context::getDeviceInterface(this->m_context);
  imageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  imageBarrier.pNext = (void *)0x0;
  imageBarrier.dstAccessMask = dstAccessMask;
  imageBarrier.oldLayout = oldLayout;
  imageBarrier.newLayout = newLayout;
  imageBarrier.srcQueueFamilyIndex = 0xffffffff;
  imageBarrier.dstQueueFamilyIndex = 0xffffffff;
  imageBarrier.subresourceRange.aspectMask = 1;
  imageBarrier.subresourceRange.baseMipLevel = 0;
  imageBarrier.subresourceRange.levelCount = 1;
  imageBarrier.subresourceRange.baseArrayLayer = 0;
  imageBarrier.subresourceRange.layerCount = 1;
  imageBarrier.srcAccessMask = srcAccessMask;
  imageBarrier.image.m_internal = image.m_internal;
  (*pDVar1->_vptr_DeviceInterface[0x6d])
            (pDVar1,commandBuffer,(ulong)srcStageMask,dstStageMask,0,0,0,0,0,1,&imageBarrier);
  return;
}

Assistant:

void TextureRenderer::addImageTransitionBarrier(VkCommandBuffer commandBuffer, VkImage image, VkPipelineStageFlags srcStageMask, VkPipelineStageFlags dstStageMask, VkAccessFlags srcAccessMask, VkAccessFlags dstAccessMask, VkImageLayout oldLayout, VkImageLayout newLayout) const
{
	const DeviceInterface&			vkd					= m_context.getDeviceInterface();

	const VkImageSubresourceRange	subResourcerange	=
	{
		VK_IMAGE_ASPECT_COLOR_BIT,		// VkImageAspectFlags	aspectMask;
		0,								// deUint32				baseMipLevel;
		1,								// deUint32				levelCount;
		0,								// deUint32				baseArrayLayer;
		1								// deUint32				layerCount;
	};

	const VkImageMemoryBarrier		imageBarrier		=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		srcAccessMask,								// VkAccessFlags			srcAccessMask;
		dstAccessMask,								// VkAccessFlags			dstAccessMask;
		oldLayout,									// VkImageLayout			oldLayout;
		newLayout,									// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					destQueueFamilyIndex;
		image,										// VkImage					image;
		subResourcerange							// VkImageSubresourceRange	subresourceRange;
	};

	vkd.cmdPipelineBarrier(commandBuffer, srcStageMask, dstStageMask, 0, 0, DE_NULL, 0, DE_NULL, 1, &imageBarrier);
}